

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O3

bool __thiscall MiddleVal::operator==(MiddleVal *this,MiddleVal *t)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  iVar3 = std::__cxx11::string::compare((char *)this);
  dVar5 = this->dVal;
  iVar1 = this->iVal;
  iVar4 = std::__cxx11::string::compare((char *)t);
  if (iVar4 == 0) {
    dVar2 = t->dVal;
  }
  else {
    dVar2 = (double)t->iVal;
  }
  if (iVar3 != 0) {
    dVar5 = (double)iVar1;
  }
  return ABS(dVar5 - dVar2) < 1e-06;
}

Assistant:

bool MiddleVal::operator==(MiddleVal t) {
    double a,b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    return fabs(a-b)<0.000001;
}